

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O0

bool tinygltf::anon_unknown_57::GetDouble(json *o,double *val)

{
  value_t vVar1;
  double dVar2;
  double *val_local;
  json *o_local;
  
  vVar1 = nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::type(o);
  if (vVar1 == number_float) {
    dVar2 = nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::get<double,_double,_0>(o);
    *val = dVar2;
  }
  return vVar1 == number_float;
}

Assistant:

bool GetDouble(const json &o, double &val) {
#ifdef TINYGLTF_USE_RAPIDJSON
  if (o.IsDouble()) {
    val = o.GetDouble();
    return true;
  }

  return false;
#else
  if (o.type() == json::value_t::number_float) {
    val = static_cast<double>(o.get<double>());
    return true;
  }

  return false;
#endif
}